

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void slang::ast::InstanceSymbol::fromFixupSyntax
               (Compilation *comp,DefinitionSymbol *definition,DataDeclarationSyntax *syntax,
               ASTContext *context,SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  Token token;
  undefined1 uVar1;
  bool bVar2;
  SourceLocation args_1;
  Diagnostic *args_2;
  long in_RDX;
  SyntaxNode *in_RDI;
  const_iterator cVar3;
  string_view sVar4;
  Token TVar5;
  string_view sVar6;
  string_view sVar7;
  Token TVar8;
  SmallVector<const_slang::ast::Symbol_*,_5UL> implicitNets;
  HierarchyInstantiationSyntax *instantiation;
  BindDirectiveInfo *in_stack_00000188;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_00000190;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_00000198;
  ASTContext *in_stack_000001a0;
  HierarchyInstantiationSyntax *in_stack_000001a8;
  Compilation *in_stack_000001b0;
  SyntaxNode *in_stack_000001c0;
  HierarchicalInstanceSyntax *instance;
  InstanceNameSyntax *instName;
  SourceLocation loc;
  DeclaratorSyntax *decl;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> instances;
  anon_class_8_1_898a5c0d missing;
  SyntaxNode *in_stack_fffffffffffffca8;
  DefinitionSymbol *in_stack_fffffffffffffcb0;
  SourceLocation *in_stack_fffffffffffffcb8;
  SourceLocation in_stack_fffffffffffffcc0;
  SourceLocation in_stack_fffffffffffffcc8;
  BumpAllocator *in_stack_fffffffffffffcd0;
  SyntaxNode *this;
  HierarchicalInstanceSyntax *in_stack_fffffffffffffcf0;
  Info *in_stack_fffffffffffffcf8;
  undefined8 in_stack_fffffffffffffd00;
  SourceLocation in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  size_t in_stack_fffffffffffffd78;
  DeclaratorSyntax *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd88;
  BumpAllocator *this_00;
  ParentList *local_268;
  string_view local_148;
  SourceLocation local_138;
  SourceLocation local_130;
  Token local_128;
  SourceLocation local_100;
  string_view local_f8;
  DeclaratorSyntax *local_e8;
  const_iterator local_e0;
  const_iterator local_c0;
  long local_b0;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_a8 [3];
  long local_18;
  SyntaxNode *local_8;
  Token *args_3;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x42265c);
  local_b0 = local_18 + 0x90;
  local_c0 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
                       ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x42267f);
  cVar3 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end
                    ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x4226be);
  sVar4._M_str = in_stack_fffffffffffffd70;
  sVar4._M_len = in_stack_fffffffffffffd78;
  TVar8.info = in_stack_fffffffffffffcf8;
  TVar8.kind = (short)in_stack_fffffffffffffd00;
  TVar8._2_1_ = (char)((ulong)in_stack_fffffffffffffd00 >> 0x10);
  TVar8.numFlags.raw = (char)((ulong)in_stack_fffffffffffffd00 >> 0x18);
  TVar8.rawLen = (int)((ulong)in_stack_fffffffffffffd00 >> 0x20);
  local_e0 = cVar3;
  while( true ) {
    this_00 = (BumpAllocator *)cVar3.index;
    local_268 = cVar3.list;
    uVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffcb0,
                       (iterator_base<const_slang::syntax::DeclaratorSyntax_*> *)
                       in_stack_fffffffffffffca8);
    if (((uVar1 ^ 0xff) & 1) == 0) break;
    in_stack_fffffffffffffd80 =
         iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
         ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                      *)0x42272d);
    local_e8 = in_stack_fffffffffffffd80;
    sVar4 = parsing::Token::valueText((Token *)in_stack_fffffffffffffcc0);
    local_f8 = sVar4;
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_f8);
    if (!bVar2) {
      in_stack_fffffffffffffd68 = parsing::Token::location(&local_e8->name);
      local_100 = in_stack_fffffffffffffd68;
      bVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::empty(local_a8);
      if (!bVar2) {
        local_130 = local_100;
        TVar5 = fromFixupSyntax::anon_class_8_1_898a5c0d::operator()
                          ((anon_class_8_1_898a5c0d *)in_stack_fffffffffffffcb8,
                           (TokenKind)((ulong)in_stack_fffffffffffffcb0 >> 0x30),
                           in_stack_fffffffffffffcc0);
        token.info = (Info *)in_stack_fffffffffffffcc0;
        token._0_8_ = in_stack_fffffffffffffcb8;
        local_128 = TVar5;
        slang::syntax::TokenOrSyntax::TokenOrSyntax
                  ((TokenOrSyntax *)in_stack_fffffffffffffcb0,token);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)in_stack_fffffffffffffcb0,
                   (TokenOrSyntax *)in_stack_fffffffffffffca8);
      }
      sVar6 = parsing::Token::rawText((Token *)in_stack_fffffffffffffcc0);
      local_148 = sVar6;
      std::basic_string_view<char,_std::char_traits<char>_>::length(&local_148);
      args_1 = SourceLocation::operator+<unsigned_long>
                         (in_stack_fffffffffffffcb8,(unsigned_long)in_stack_fffffffffffffcb0);
      local_138 = args_1;
      local_100 = args_1;
      args_2 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffcc0,
                                   SUB84((ulong)in_stack_fffffffffffffcd0 >> 0x20,0),
                                   in_stack_fffffffffffffcc8);
      sVar7 = DefinitionSymbol::getKindString(in_stack_fffffffffffffcb0);
      args_3 = (Token *)sVar7._M_len;
      sVar7._M_str = TVar8._0_8_;
      sVar7._M_len = (size_t)TVar8.info;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffcf0,sVar7);
      BumpAllocator::
      emplace<slang::syntax::InstanceNameSyntax,slang::parsing::Token_const&,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>const&>
                (in_stack_fffffffffffffcd0,(Token *)in_stack_fffffffffffffcc8,
                 (SyntaxList<slang::syntax::VariableDimensionSyntax> *)in_stack_fffffffffffffcc0);
      fromFixupSyntax::anon_class_8_1_898a5c0d::operator()
                ((anon_class_8_1_898a5c0d *)in_stack_fffffffffffffcb8,
                 (TokenKind)((ulong)in_stack_fffffffffffffcb0 >> 0x30),in_stack_fffffffffffffcc0);
      std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::span
                ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0x422a56);
      TVar8 = fromFixupSyntax::anon_class_8_1_898a5c0d::operator()
                        ((anon_class_8_1_898a5c0d *)in_stack_fffffffffffffcb8,
                         (TokenKind)((ulong)in_stack_fffffffffffffcb0 >> 0x30),
                         in_stack_fffffffffffffcc0);
      in_stack_fffffffffffffcf0 =
           BumpAllocator::
           emplace<slang::syntax::HierarchicalInstanceSyntax,slang::syntax::InstanceNameSyntax*&,slang::parsing::Token,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token>
                     ((BumpAllocator *)sVar6._M_len,(InstanceNameSyntax **)sVar6._M_str,
                      (Token *)args_1,
                      (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)args_2,args_3);
      slang::syntax::TokenOrSyntax::TokenOrSyntax
                ((TokenOrSyntax *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)in_stack_fffffffffffffcb0,
                 (TokenOrSyntax *)in_stack_fffffffffffffca8);
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                *)in_stack_fffffffffffffcb0);
    cVar3.index = (size_t)this_00;
    cVar3.list = local_268;
  }
  this = local_8;
  std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::span
            ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)0x422b42);
  not_null<slang::syntax::DataTypeSyntax_*>::operator->
            ((not_null<slang::syntax::DataTypeSyntax_*> *)0x422b56);
  TVar8 = slang::syntax::SyntaxNode::getFirstToken(this);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
            (local_a8,(EVP_PKEY_CTX *)local_8,(EVP_PKEY_CTX *)TVar8.info);
  BumpAllocator::
  emplace<slang::syntax::HierarchyInstantiationSyntax,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::parsing::Token,decltype(nullptr),std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token_const&>
            (this_00,(span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)
                     CONCAT17(uVar1,in_stack_fffffffffffffd88),(Token *)in_stack_fffffffffffffd80,
             (void **)sVar4._M_len,
             (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)sVar4._M_str,
             (Token *)in_stack_fffffffffffffd68);
  SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0x422c33);
  fromSyntax(in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,in_stack_00000198,
             in_stack_00000190,in_stack_00000188,in_stack_000001c0);
  SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0x422c81);
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x422c8e);
  return;
}

Assistant:

void InstanceSymbol::fromFixupSyntax(Compilation& comp, const DefinitionSymbol& definition,
                                     const DataDeclarationSyntax& syntax, const ASTContext& context,
                                     SmallVectorBase<const Symbol*>& results) {
    auto missing = [&](TokenKind tk, SourceLocation loc) {
        return Token::createMissing(comp, tk, loc);
    };

    // Fabricate a fake instantiation syntax to let us reuse all of the real logic
    // for this fixup case.
    SmallVector<TokenOrSyntax, 4> instances;
    for (auto decl : syntax.declarators) {
        if (decl->name.valueText().empty())
            continue;

        auto loc = decl->name.location();
        if (!instances.empty())
            instances.push_back(missing(TokenKind::Comma, loc));

        loc = loc + decl->name.rawText().length();
        context.addDiag(diag::InstanceMissingParens, loc) << definition.getKindString();

        auto instName = comp.emplace<InstanceNameSyntax>(decl->name, decl->dimensions);
        auto instance = comp.emplace<HierarchicalInstanceSyntax>(
            instName, missing(TokenKind::OpenParenthesis, loc), std::span<TokenOrSyntax>(),
            missing(TokenKind::CloseParenthesis, loc));

        instances.push_back(instance);
    }

    auto instantiation = comp.emplace<HierarchyInstantiationSyntax>(
        std::span<AttributeInstanceSyntax*>(), syntax.type->getFirstToken(), nullptr,
        instances.copy(comp), syntax.semi);

    SmallVector<const Symbol*> implicitNets;
    fromSyntax(comp, *instantiation, context, results, implicitNets);
    SLANG_ASSERT(implicitNets.empty());
}